

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

shared_ptr<httplib::Response> __thiscall
httplib::Client::Delete(Client *this,char *path,Headers *headers)

{
  element_type *__buf;
  ulong uVar1;
  _Invoker_type in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  shared_ptr<httplib::Response> sVar2;
  undefined1 local_1b8 [8];
  shared_ptr<httplib::Response> res;
  undefined1 local_198 [8];
  Request req;
  Headers *headers_local;
  char *path_local;
  Client *this_local;
  
  req.progress._M_invoker = in_RCX;
  Request::Request((Request *)local_198);
  std::__cxx11::string::operator=((string *)(req.version.field_2._M_local_buf + 8),"DELETE");
  std::__cxx11::string::operator=((string *)(req.target.field_2._M_local_buf + 8),(char *)headers);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&req.path.field_2 + 8),
              (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)req.progress._M_invoker);
  std::make_shared<httplib::Response>();
  __buf = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_1b8);
  uVar1 = send((Client *)path,(int)local_198,__buf,(size_t)in_RCX,in_R8D);
  if ((uVar1 & 1) == 0) {
    std::shared_ptr<httplib::Response>::shared_ptr
              ((shared_ptr<httplib::Response> *)this,(nullptr_t)0x0);
  }
  else {
    std::shared_ptr<httplib::Response>::shared_ptr
              ((shared_ptr<httplib::Response> *)this,(shared_ptr<httplib::Response> *)local_1b8);
  }
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_1b8);
  Request::~Request((Request *)local_198);
  sVar2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<httplib::Response>)
         sVar2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Response> Client::Delete(const char* path, const Headers& headers)
{
    Request req;
    req.method = "DELETE";
    req.path = path;
    req.headers = headers;

    auto res = std::make_shared<Response>();

    return send(req, *res) ? res : nullptr;
}